

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_list_or_eof(EditLine *el,wint_t c)

{
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).cursor == (el->el_line).lastchar) {
    if ((el->el_line).cursor == (el->el_line).buffer) {
      terminal_writec(el,c);
      el_local._7_1_ = '\x02';
    }
    else {
      terminal_beep(el);
      el_local._7_1_ = '\x06';
    }
  }
  else {
    terminal_beep(el);
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_list_or_eof(EditLine *el, wint_t c)
{

	if (el->el_line.cursor == el->el_line.lastchar) {
		if (el->el_line.cursor == el->el_line.buffer) {
			terminal_writec(el, c);	/* then do a EOF */
			return CC_EOF;
		} else {
			/*
			 * Here we could list completions, but it is an
			 * error right now
			 */
			terminal_beep(el);
			return CC_ERROR;
		}
	} else {
#ifdef notyet
		re_goto_bottom(el);
		*el->el_line.lastchar = '\0';	/* just in case */
		return CC_LIST_CHOICES;
#else
		/*
		 * Just complain for now.
		 */
		terminal_beep(el);
		return CC_ERROR;
#endif
	}
}